

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector3.h
# Opt level: O2

bool __thiscall esfera::acerto(esfera *this,raio *raio,double tMin,double tMax,acerto *acerto)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  vector3 normalParaFora;
  ponto3 local_38;
  
  dVar2 = (raio->origem).e[0] - (this->centro).e[0];
  dVar4 = (raio->origem).e[1] - (this->centro).e[1];
  dVar6 = (raio->origem).e[2] - (this->centro).e[2];
  dVar3 = (raio->direcao).e[0];
  dVar7 = (raio->direcao).e[1];
  dVar1 = (raio->direcao).e[2];
  dVar5 = dVar1 * dVar1 + dVar3 * dVar3 + dVar7 * dVar7;
  dVar7 = dVar1 * dVar6 + dVar7 * dVar4 + dVar2 * dVar3;
  dVar3 = dVar7 * dVar7 -
          ((dVar6 * dVar6 + dVar2 * dVar2 + dVar4 * dVar4) - this->raioEsfera * this->raioEsfera) *
          dVar5;
  if (dVar3 < 0.0) {
    return false;
  }
  if (dVar3 < 0.0) {
    dVar3 = sqrt(dVar3);
  }
  else {
    dVar3 = SQRT(dVar3);
  }
  dVar1 = (-dVar7 - dVar3) / dVar5;
  if ((dVar1 < tMin) || (tMax < dVar1)) {
    dVar1 = (dVar3 - dVar7) / dVar5;
    if (dVar1 < tMin) {
      return false;
    }
    if (tMax < dVar1) {
      return false;
    }
  }
  acerto->t = dVar1;
  ::raio::em(&local_38,raio,dVar1);
  (acerto->ponto).e[2] = local_38.e[2];
  (acerto->ponto).e[0] = local_38.e[0];
  (acerto->ponto).e[1] = local_38.e[1];
  local_38.e[1] = 1.0 / this->raioEsfera;
  local_38.e[2] = ((acerto->ponto).e[2] - (this->centro).e[2]) * local_38.e[1];
  local_38.e[0] = local_38.e[1] * ((acerto->ponto).e[0] - (this->centro).e[0]);
  local_38.e[1] = local_38.e[1] * ((acerto->ponto).e[1] - (this->centro).e[1]);
  ::acerto::definirNormalDaFace(acerto,raio,&local_38);
  return true;
}

Assistant:

inline vector3 operator-(const vector3 &u, const vector3 &v) {
    return {u.e[0] - v.e[0], u.e[1] - v.e[1], u.e[2] - v.e[2]};
}